

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O2

TypeNames * __thiscall
wasm::ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>::
getNames(TypeNames *__return_storage_ptr__,
        ModuleTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>_>
        *this,HeapType type)

{
  const_iterator cVar1;
  HeapType local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  cVar1 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->wasm->typeNames)._M_h,&local_20);
  if (cVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>._M_cur
      == (__node_type *)0x0) {
    IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>::getNames
              (__return_storage_ptr__,this->fallback,local_20);
  }
  else {
    TypeNames::TypeNames
              (__return_storage_ptr__,
               (TypeNames *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                      ._M_cur + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

TypeNames getNames(HeapType type) {
    if (auto it = wasm.typeNames.find(type); it != wasm.typeNames.end()) {
      return it->second;
    }
    return fallback.getNames(type);
  }